

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::ParseBoneTrafoKeys_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntFrameInfo_MDL7 *frame,
          IntSharedData_MDL7 *shared)

{
  Frame_MDL7 *pFVar1;
  uchar *puVar2;
  Logger *this_00;
  uint uVar3;
  BoneTransform_MDL7 *pcBoneTransforms;
  
  pFVar1 = frame->pcFrame;
  if (pFVar1->transmatrix_count != 0) {
    if (groupInfo->iIndex != 0) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Ignoring animation keyframes in groups != 0");
      return;
    }
    if (frame->pcFrame->transmatrix_count != 0) {
      puVar2 = this->mBuffer;
      pcBoneTransforms =
           (BoneTransform_MDL7 *)
           (pFVar1->frame_name +
           (ulong)((uint)*(ushort *)(puVar2 + 0x2a) * pFVar1->vertices_count) +
           (ulong)*(ushort *)(puVar2 + 0x2e));
      uVar3 = 0;
      do {
        if ((uint)pcBoneTransforms->bone_index < *(uint *)(puVar2 + 8)) {
          AddAnimationBoneTrafoKey_3DGS_MDL7
                    (this,frame->iIndex,pcBoneTransforms,shared->apcOutBones);
        }
        else {
          this = (MDLImporter *)DefaultLogger::get();
          Logger::warn((Logger *)this,
                       "Index overflow in frame area. Unable to parse this bone transformation");
        }
        pcBoneTransforms =
             (BoneTransform_MDL7 *)((long)pcBoneTransforms->m + (ulong)*(ushort *)(puVar2 + 0x2c));
        uVar3 = uVar3 + 1;
      } while (uVar3 < frame->pcFrame->transmatrix_count);
    }
  }
  return;
}

Assistant:

void MDLImporter::ParseBoneTrafoKeys_3DGS_MDL7(
    const MDL::IntGroupInfo_MDL7& groupInfo,
    IntFrameInfo_MDL7&            frame,
    MDL::IntSharedData_MDL7&      shared)
{
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;

    // only the first group contains bone animation keys
    if (frame.pcFrame->transmatrix_count)   {
        if (!groupInfo.iIndex)  {
            // skip all frames vertices. We can't support them
            const MDL::BoneTransform_MDL7* pcBoneTransforms = (const MDL::BoneTransform_MDL7*)
                (((const char*)frame.pcFrame) + pcHeader->frame_stc_size +
                frame.pcFrame->vertices_count * pcHeader->framevertex_stc_size);

            // read all transformation matrices
            for (unsigned int iTrafo = 0; iTrafo < frame.pcFrame->transmatrix_count;++iTrafo)   {
                if(pcBoneTransforms->bone_index >= pcHeader->bones_num) {
                    ASSIMP_LOG_WARN("Index overflow in frame area. "
                        "Unable to parse this bone transformation");
                }
                else    {
                    AddAnimationBoneTrafoKey_3DGS_MDL7(frame.iIndex,
                        pcBoneTransforms,shared.apcOutBones);
                }
                pcBoneTransforms = (const MDL::BoneTransform_MDL7*)(
                    (const char*)pcBoneTransforms + pcHeader->bonetrans_stc_size);
            }
        }
        else    {
            ASSIMP_LOG_WARN("Ignoring animation keyframes in groups != 0");
        }
    }
}